

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_clear(GCtab *t)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  Node *node;
  GCtab *t_local;
  TValue *array;
  uint32_t asize;
  uint32_t i;
  Node *n;
  Node *node_1;
  uint32_t hmask;
  uint32_t i_1;
  
  uVar1 = t->asize;
  uVar2 = (t->array).ptr32;
  for (i = 0; i < uVar1; i = i + 1) {
    *(undefined4 *)((ulong)uVar2 + 4 + (ulong)i * 8) = 0xffffffff;
  }
  if (t->hmask != 0) {
    uVar1 = (t->node).ptr32;
    *(uint *)((ulong)uVar1 + 0x14) = uVar1 + (t->hmask + 1) * 0x18;
    uVar1 = t->hmask;
    uVar2 = (t->node).ptr32;
    for (i_1 = 0; i_1 <= uVar1; i_1 = i_1 + 1) {
      lVar3 = (ulong)uVar2 + (ulong)i_1 * 0x18;
      *(undefined4 *)(lVar3 + 0x10) = 0;
      *(undefined4 *)(lVar3 + 0xc) = 0xffffffff;
      *(undefined4 *)(lVar3 + 4) = 0xffffffff;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_clear(GCtab *t)
{
  clearapart(t);
  if (t->hmask > 0) {
    Node *node = noderef(t->node);
    setfreetop(t, node, &node[t->hmask+1]);
    clearhpart(t);
  }
}